

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.cpp
# Opt level: O0

void (anonymous_namespace)::
     accept_test_case<std::map<std::__cxx11::string,std::vector<ut::test_case*,std::allocator<ut::test_case*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ut::test_case*,std::allocator<ut::test_case*>>>>>>
               (void *map,test_case *i_test)

{
  char *pcVar1;
  mapped_type *this;
  allocator local_49;
  immutable_basic_string<char> local_48 [16];
  string local_38 [32];
  test_case *local_18;
  test_case *i_test_local;
  void *map_local;
  
  local_18 = i_test;
  i_test_local = (test_case *)map;
  (**(code **)(*(long *)i_test + 0x10))();
  pcVar1 = ut::exportable::immutable_basic_string<char>::c_str(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_49);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>_>_>_>
                       *)map,(key_type *)local_38);
  std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>::push_back(this,&local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  ut::exportable::immutable_basic_string<char>::~immutable_basic_string(local_48);
  return;
}

Assistant:

void accept_test_case(void *map, ut::test_case *i_test)
	{
		(*static_cast<MapT*>(map))[i_test->fixture_name().c_str()].push_back(i_test);
	}